

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgclient.c
# Opt level: O0

int mg_connect_ca(mg_session_params *params,mg_session **session,mg_allocator *allocator)

{
  int iVar1;
  int iVar2;
  undefined8 *in_RSI;
  long in_RDI;
  int trust_result;
  char hostname [1025];
  char ip [46];
  mg_secure_transport *ttransport;
  sockaddr peer_addr;
  int sockfd;
  int status;
  mg_session *tsession;
  mg_session_params *in_stack_fffffffffffffb68;
  uint in_stack_fffffffffffffb74;
  mg_session *in_stack_fffffffffffffb78;
  int in_stack_fffffffffffffb80;
  int in_stack_fffffffffffffb84;
  mg_session *in_stack_fffffffffffffb88;
  char *in_stack_fffffffffffffb90;
  sockaddr *in_stack_fffffffffffffb98;
  mg_session *in_stack_fffffffffffffbd0;
  sockaddr *in_stack_fffffffffffffbd8;
  int *in_stack_fffffffffffffbe0;
  mg_session_params *in_stack_fffffffffffffbe8;
  mg_allocator *in_stack_fffffffffffffc00;
  mg_secure_transport **in_stack_fffffffffffffc08;
  char *in_stack_fffffffffffffc10;
  char *in_stack_fffffffffffffc18;
  int in_stack_fffffffffffffc20;
  undefined1 local_78 [48];
  mg_transport *local_48;
  int local_30;
  int local_2c;
  mg_session *local_28;
  undefined8 *local_18;
  long local_10;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_28 = mg_session_init((mg_allocator *)in_stack_fffffffffffffb78);
  if (local_28 == (mg_session *)0x0) {
    return -3;
  }
  local_2c = 0;
  local_30 = -1;
  local_2c = validate_session_params(in_stack_fffffffffffffb68,(mg_session *)0x10560a);
  if ((local_2c != 0) ||
     (local_2c = init_tcp_connection(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,
                                     in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0),
     local_2c != 0)) goto LAB_00105888;
  if (*(int *)(local_10 + 0x30) == 0) {
    local_2c = mg_raw_transport_init
                         (in_stack_fffffffffffffb80,(mg_raw_transport **)in_stack_fffffffffffffb78,
                          (mg_allocator *)((ulong)in_stack_fffffffffffffb74 << 0x20));
    if (local_2c != 0) {
      mg_session_set_error(local_28,"failed to initialize connection");
      goto LAB_00105888;
    }
    iVar2 = 0;
  }
  else {
    if (*(int *)(local_10 + 0x30) != 1) {
      abort();
    }
    local_2c = mg_secure_transport_init
                         (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                          in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                          in_stack_fffffffffffffc00);
    if (local_2c != 0) {
      mg_session_set_error(local_28,"failed to initialize secure connection");
      goto LAB_00105888;
    }
    local_28->transport = local_48;
    iVar2 = 0;
    if (*(long *)(local_10 + 0x48) != 0) {
      local_2c = get_hostname_and_ip(in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
                                     (char *)in_stack_fffffffffffffb88,
                                     (mg_session *)
                                     CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
      if (local_2c != 0) goto LAB_00105888;
      iVar1 = (**(code **)(local_10 + 0x48))
                        (&stack0xfffffffffffffb78,local_78,local_48[1].destroy,
                         local_48[1].suspend_until_ready_to_read,*(undefined8 *)(local_10 + 0x50));
      iVar2 = local_2c;
      if (iVar1 != 0) {
        mg_session_set_error(local_28,"trust callback returned non-zero value");
        local_2c = -0x12;
        goto LAB_00105888;
      }
    }
  }
  local_2c = iVar2;
  local_30 = -1;
  local_2c = mg_bolt_handshake(in_stack_fffffffffffffb78);
  if ((local_2c == 0) &&
     (local_2c = mg_bolt_init(in_stack_fffffffffffffb88,
                              (mg_session_params *)
                              CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80)),
     local_2c == 0)) {
    local_28->status = 0;
    *local_18 = local_28;
    return 0;
  }
LAB_00105888:
  if ((-1 < local_30) && (iVar2 = mg_socket_close(in_stack_fffffffffffffb84), iVar2 != 0)) {
    abort();
  }
  *local_18 = local_28;
  mg_session_invalidate((mg_session *)0x1058c8);
  return local_2c;
}

Assistant:

int mg_connect_ca(const mg_session_params *params, mg_session **session,
                  mg_allocator *allocator) {
  // Useful read https://akkadia.org/drepper/userapi-ipv6.html.
  mg_session *tsession = mg_session_init(allocator);
  if (!tsession) {
    return MG_ERROR_OOM;
  }

  int status = 0;
  int sockfd = -1;

  status = validate_session_params(params, tsession);
  if (status != 0) {
    goto cleanup;
  }

  struct sockaddr peer_addr;
  status = init_tcp_connection(params, &sockfd, &peer_addr, tsession);
  if (status != 0) {
    goto cleanup;
  }
  switch (params->sslmode) {
    case MG_SSLMODE_DISABLE:
      status = mg_raw_transport_init(
          sockfd, (mg_raw_transport **)&tsession->transport, allocator);
      if (status != 0) {
        mg_session_set_error(tsession, "failed to initialize connection");
        goto cleanup;
      }
      break;
#ifndef __EMSCRIPTEN__
    case MG_SSLMODE_REQUIRE: {
      mg_secure_transport *ttransport;
      status = mg_secure_transport_init(sockfd, params->sslcert, params->sslkey,
                                        &ttransport, allocator);
      if (status != 0) {
        mg_session_set_error(tsession,
                             "failed to initialize secure connection");
        goto cleanup;
      }
      tsession->transport = (mg_transport *)ttransport;
      if (params->trust_callback) {
        char ip[INET6_ADDRSTRLEN];
        char hostname[NI_MAXHOST];
        status = get_hostname_and_ip(&peer_addr, hostname, ip, tsession);
        if (status != 0) {
          goto cleanup;
        }
        int trust_result = params->trust_callback(
            hostname, ip, ttransport->peer_pubkey_type,
            ttransport->peer_pubkey_fp, params->trust_data);
        if (trust_result != 0) {
          mg_session_set_error(tsession,
                               "trust callback returned non-zero value");
          status = MG_ERROR_TRUST_CALLBACK;
          goto cleanup;
        }
      }
      break;
    }
#endif
    default:
      // Should not get here.
      abort();
  }

  // mg_transport object took ownership of the socket.
  sockfd = -1;
  status = mg_bolt_handshake(tsession);
  if (status != 0) {
    goto cleanup;
  }
  status = mg_bolt_init(tsession, params);
  if (status != 0) {
    goto cleanup;
  }

  tsession->status = MG_SESSION_READY;
  *session = tsession;
  return 0;

cleanup:
  if (sockfd >= 0 && mg_socket_close(sockfd) != 0) {
    abort();
  }
  *session = tsession;
  mg_session_invalidate(tsession);
  return status;
}